

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferViewVkImpl.cpp
# Opt level: O1

void __thiscall Diligent::BufferViewVkImpl::~BufferViewVkImpl(BufferViewVkImpl *this)

{
  RenderDeviceVkImpl *this_00;
  IBuffer *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  
  this_00 = (this->super_BufferViewBase<Diligent::EngineVkImplTraits>).
            super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
            .m_pDevice;
  iVar2 = (*(((this->super_BufferViewBase<Diligent::EngineVkImplTraits>).m_pBuffer)->
            super_IDeviceObject).super_IObject._vptr_IObject[4])();
  RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
  ::
  SafeReleaseDeviceObject<VulkanUtilities::VulkanObjectWrapper<VkBufferView_T*,(VulkanUtilities::VulkanHandleTypeId)3>,void>
            ((RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,Diligent::ICommandQueueVk>
              *)this_00,&this->m_BuffView,*(Uint64 *)(CONCAT44(extraout_var,iVar2) + 0x20));
  VulkanUtilities::VulkanObjectWrapper<VkBufferView_T_*,_(VulkanUtilities::VulkanHandleTypeId)3>::
  ~VulkanObjectWrapper(&this->m_BuffView);
  (this->super_BufferViewBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
  .super_ObjectBase<Diligent::IBufferViewVk>.super_RefCountedObject<Diligent::IBufferViewVk>.
  super_IBufferViewVk.super_IBufferView.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_009334c0;
  pIVar1 = (this->super_BufferViewBase<Diligent::EngineVkImplTraits>).m_spBuffer.m_pObject;
  if (pIVar1 != (IBuffer *)0x0) {
    (*(pIVar1->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    (this->super_BufferViewBase<Diligent::EngineVkImplTraits>).m_spBuffer.m_pObject = (IBuffer *)0x0
    ;
  }
  DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
  ::~DeviceObjectBase((DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
                       *)this);
  return;
}

Assistant:

BufferViewVkImpl::~BufferViewVkImpl()
{
    m_pDevice->SafeReleaseDeviceObject(std::move(m_BuffView), m_pBuffer->GetDesc().ImmediateContextMask);
}